

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_ptime.c
# Opt level: O0

uint fmt_taia(char *s,taia *t)

{
  int local_1c;
  int i;
  taia *t_local;
  char *s_local;
  
  taia_pack(fmt_taia::pack,t);
  *s = '@';
  for (local_1c = 0; local_1c < 0xc; local_1c = local_1c + 1) {
    s[local_1c * 2 + 1] = fmt_taia::hex[(int)((int)fmt_taia::pack[local_1c] >> 4 & 0xf)];
    s[local_1c * 2 + 2] = fmt_taia::hex[(int)((int)fmt_taia::pack[local_1c] & 0xf)];
  }
  return 0x19;
}

Assistant:

unsigned int fmt_taia(char *s, struct taia *t) {
  static char hex[16] ="0123456789abcdef";
  static char pack[TAIA_PACK];
  int i;

  taia_pack(pack, t);
  s[0] ='@';
  for (i =0; i < 12; ++i) {
    s[i *2 +1] =hex[(pack[i] >>4) &15];
    s[i *2 +2] =hex[pack[i] &15];
  }
  return(25);
}